

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O1

void __thiscall Markov::Connection::TrainPart(Connection *this,string_view src,TrainData *td)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *this_00;
  string_view src_00;
  regex_type nline;
  sviterator iter;
  bool local_171;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_160;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_140;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_b8;
  
  if ((td->conf).splitstr == true) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_160,"\\n+",0x10);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_token_iterator(&local_140,src._M_str,src._M_str + src._M_len,&local_160,-1,0);
    while (this_00 = &local_140,
          bVar2 = std::__cxx11::
                  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                  operator==(&local_140,&td->badIter), !bVar2) {
      pcVar4 = ((local_140._M_result)->super_pair<const_char_*,_const_char_*>).first;
      pcVar1 = ((local_140._M_result)->super_pair<const_char_*,_const_char_*>).second +
               -(long)pcVar4;
      if (((local_140._M_result)->matched & 1U) == 0) {
        pcVar4 = (char *)0x0;
        pcVar1 = (char *)0x0;
      }
      src_00._M_str = pcVar4;
      src_00._M_len = (size_t)pcVar1;
      TrainFinal((Connection *)this_00,src_00,td);
      local_170._M_len = 1;
      local_170._M_str = "\n";
      local_171 = false;
      if ((td->func).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_0012b2e1;
      }
      (*(td->func)._M_invoker)((_Any_data *)&td->func,&local_170,&local_171);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      operator++(&local_b8,&local_140,0);
      if (local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_b8._M_position._M_match.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_140._M_position._M_match.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_140._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_140._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_160);
  }
  else {
    TrainFinal(this,src,td);
  }
  local_140._M_position._M_begin = (char *)0x0;
  local_140._M_position._M_end = "";
  local_160._M_flags._0_1_ = 1;
  if ((td->func).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(td->func)._M_invoker)
              ((_Any_data *)&td->func,(basic_string_view<char,_std::char_traits<char>_> *)&local_140
               ,(bool *)&local_160);
    return;
  }
LAB_0012b2e1:
  uVar3 = std::__throw_bad_function_call();
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_160);
  _Unwind_Resume(uVar3);
}

Assistant:

void Connection::TrainPart(std::string_view src, const TrainData& td) {
		if (td.conf.splitstr) {
				regex_type nline("\\n+");

				for (auto iter = sviterator(src.begin(), src.end(), nline, -1); iter != td.badIter; iter++) {
						TrainFinal(matchToSv(*iter), td);
						td.func("\n", false);
						}
				}
		else {
				TrainFinal(src, td);
				}

		td.func("", true);
		}